

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.hpp
# Opt level: O3

Image4u * eos::core::image::resize
                    (Image4u *__return_storage_ptr__,Image4u *image,int width,int height)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  uchar uVar5;
  int y;
  int iVar6;
  Pixel<unsigned_char,_4> *pPVar7;
  int iVar8;
  int iVar9;
  int x;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar18 [16];
  int source_x;
  int local_b0;
  
  iVar6 = image->width_;
  iVar9 = image->height_;
  Image<eos::core::Pixel<unsigned_char,_4>_>::Image(__return_storage_ptr__,height,width);
  if (0 < width) {
    fVar10 = (float)width / (float)iVar6;
    fVar11 = (float)height / (float)iVar9;
    local_b0 = 0;
    do {
      if (0 < height) {
        fVar12 = (float)local_b0 / fVar10;
        fVar13 = ceilf(fVar12);
        fVar14 = floorf(((float)local_b0 + 1.0) / fVar10);
        fVar12 = roundf(fVar12);
        iVar6 = (int)fVar12;
        iVar9 = 0;
        do {
          fVar12 = (float)iVar9 / fVar11;
          iVar17 = 0;
          iVar19 = 0;
          iVar20 = 0;
          iVar21 = 0;
          if (fVar14 < (float)(int)fVar13) {
LAB_00186bc2:
            fVar12 = roundf(fVar12);
            iVar8 = (int)fVar12;
            if (iVar8 < image->height_) {
              auVar18._4_4_ = iVar19;
              auVar18._0_4_ = iVar17;
              auVar18._8_4_ = iVar20;
              auVar18._12_4_ = iVar21;
              if (iVar6 < image->width_) {
                pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar8,iVar6);
                bVar1 = (pPVar7->data_)._M_elems[0];
                pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar8,iVar6);
                uVar4 = (pPVar7->data_)._M_elems[1];
                pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar8,iVar6);
                uVar5 = (pPVar7->data_)._M_elems[2];
                pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,iVar8,iVar6);
                auVar18._1_3_ = 0;
                auVar18[0] = bVar1;
                auVar18[4] = uVar4;
                auVar18._5_3_ = 0;
                auVar18[8] = uVar5;
                auVar18._9_3_ = 0;
                auVar18[0xc] = (pPVar7->data_)._M_elems[3];
                auVar18._13_3_ = 0;
              }
            }
            else {
              auVar18._4_4_ = iVar19;
              auVar18._0_4_ = iVar17;
              auVar18._8_4_ = iVar20;
              auVar18._12_4_ = iVar21;
            }
          }
          else {
            fVar15 = ceilf(fVar12);
            fVar16 = floorf(((float)iVar9 + 1.0) / fVar11);
            iVar17 = 0;
            iVar19 = 0;
            iVar20 = 0;
            iVar21 = 0;
            iVar8 = 0;
            y = (int)fVar15;
            x = (int)fVar13;
            do {
              for (; (float)y <= fVar16; y = y + 1) {
                if ((x < image->width_) && (y < image->height_)) {
                  iVar8 = iVar8 + 1;
                  pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  bVar1 = (pPVar7->data_)._M_elems[0];
                  pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  bVar2 = (pPVar7->data_)._M_elems[1];
                  pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  bVar3 = (pPVar7->data_)._M_elems[2];
                  pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
                  iVar17 = iVar17 + (uint)bVar1;
                  iVar19 = iVar19 + (uint)bVar2;
                  iVar20 = iVar20 + (uint)bVar3;
                  iVar21 = iVar21 + (uint)(pPVar7->data_)._M_elems[3];
                }
              }
              x = x + 1;
              y = (int)fVar15;
            } while ((float)x <= fVar14);
            if (iVar8 < 1) goto LAB_00186bc2;
            auVar18._12_4_ = iVar21 / iVar8;
            auVar18._8_4_ = iVar20 / iVar8;
            auVar18._4_4_ = iVar19 / iVar8;
            auVar18._0_4_ = iVar17 / iVar8;
          }
          pPVar7 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                             (__return_storage_ptr__,iVar9,local_b0);
          *(uint *)(pPVar7->data_)._M_elems =
               auVar18._0_4_ & 0xff |
               (auVar18._4_4_ & 0xff) << 8 | (auVar18._8_4_ & 0xff) << 0x10 | auVar18._12_4_ << 0x18
          ;
          iVar9 = iVar9 + 1;
        } while (iVar9 != height);
      }
      local_b0 = local_b0 + 1;
    } while (local_b0 != width);
  }
  return __return_storage_ptr__;
}

Assistant:

inline eos::core::Image4u resize(const eos::core::Image4u& image, int width, int height)
{
    using Eigen::Vector4i;
    using std::ceil;
    using std::floor;
    using std::round;
    using std::uint8_t;

    const float scaling_width = static_cast<float>(width) / image.width();
    const float scaling_height = static_cast<float>(height) / image.height();

    eos::core::Image4u resized_image(height, width);
    for (int w = 0; w < width; ++w)
    {
        for (int h = 0; h < height; ++h)
        {
            const float left = (static_cast<float>(w)) / scaling_width;
            const float right = (static_cast<float>(w) + 1.0f) / scaling_width;
            const float bottom = (static_cast<float>(h)) / scaling_height;
            const float top = (static_cast<float>(h) + 1.0f) / scaling_height;

            Vector4i color = Vector4i::Zero(); // std::uint8_t actually.
            int num_texels = 0;
            // loop over square in which quadrangle out of the four corners of pixel is
            for (int a = ceil(left); a <= floor(right); ++a)
            {
                for (int b = ceil(bottom); b <= floor(top); ++b)
                {
                    // check if texel is in image
                    if (a < image.width() && b < image.height())
                    {
                        num_texels++;
                        color += Vector4i(image(b, a)[0], image(b, a)[1], image(b, a)[2], image(b, a)[3]);
                    }
                }
            }
            if (num_texels > 0)
                color = color / num_texels;
            else
            { // if no corresponding texel found, nearest neighbour interpolation
              // calculate corresponding position of dst_coord pixel center in image (src)
                const int source_x = round(static_cast<float>(w) / scaling_width);
                const int source_y = round(static_cast<float>(h) / scaling_height);

                if (source_y < image.height() && source_x < image.width())
                {
                    color = Vector4i(image(source_y, source_x)[0], image(source_y, source_x)[1],
                                     image(source_y, source_x)[2], image(source_y, source_x)[3]);
                }
            }

            resized_image(h, w) = {
                static_cast<std::uint8_t>(round(color[0])), static_cast<std::uint8_t>(round(color[1])),
                static_cast<std::uint8_t>(round(color[2])), static_cast<std::uint8_t>(round(color[3]))};
        }
    }

    return resized_image;
}